

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O3

REF_STATUS ref_fixture_quad_brick_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_INT dim)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  bool bVar16;
  REF_INT edg [3];
  REF_INT cell;
  REF_INT node;
  REF_INT quad [5];
  int local_90;
  int local_8c;
  undefined4 local_88;
  REF_INT local_84;
  ulong local_80;
  REF_GRID_conflict local_78;
  double local_70;
  REF_DBL local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined4 local_48;
  ulong local_38;
  
  uVar11 = (ulong)(uint)dim;
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    pRVar1->twod = 1;
    if (pRVar1->mpi->id == 0) {
      iVar4 = dim + -1;
      local_80 = uVar11;
      local_78 = pRVar1;
      if (0 < dim) {
        local_70 = 1.0 / (double)iVar4;
        lVar13 = 0;
        uVar5 = 0;
        do {
          local_68 = (double)(int)uVar5 * local_70 + 0.0;
          uVar14 = 0;
          local_38 = uVar5;
          do {
            uVar3 = ref_node_add(ref_node,lVar13 + uVar14,&local_5c);
            if (uVar3 != 0) {
              uVar11 = (ulong)uVar3;
              pcVar12 = "node";
              uVar7 = 0x7bd;
              goto LAB_0012df38;
            }
            pRVar2 = ref_node->real;
            lVar6 = (long)local_5c;
            pRVar2[lVar6 * 0xf] = (double)(int)uVar14 * local_70 + 0.0;
            pRVar2[lVar6 * 0xf + 1] = local_68;
            pRVar2[lVar6 * 0xf + 2] = 0.0;
            uVar14 = uVar14 + 1;
          } while (uVar11 != uVar14);
          uVar5 = local_38 + 1;
          lVar13 = lVar13 + uVar11;
        } while (uVar5 != uVar11);
      }
      local_88 = 1;
      iVar8 = 0;
      if (0 < iVar4) {
        iVar8 = iVar4;
      }
      iVar9 = 0;
      do {
        if (iVar8 == iVar9) {
          local_88 = 2;
          iVar8 = iVar8 + 1;
          iVar9 = (int)local_80 * 2 + -1;
          iVar15 = iVar4;
          goto LAB_0012e13c;
        }
        local_90 = iVar9;
        local_8c = iVar9 + 1;
        uVar3 = ref_cell_add(local_78->cell[0],&local_90,&local_84);
        iVar9 = iVar9 + 1;
      } while (uVar3 == 0);
      uVar11 = (ulong)uVar3;
      pcVar12 = "qua";
      uVar7 = 0x7c9;
    }
    else {
      uVar3 = ref_node_initialize_n_global(ref_node,(ulong)(uint)(dim * dim));
      if (uVar3 == 0) {
        return 0;
      }
      uVar11 = (ulong)uVar3;
      pcVar12 = "init glob";
      uVar7 = 0x7ab;
    }
  }
  else {
    uVar11 = (ulong)uVar3;
    pcVar12 = "create";
    uVar7 = 0x7a4;
  }
  goto LAB_0012df38;
  while( true ) {
    local_90 = iVar15;
    local_8c = iVar9;
    uVar3 = ref_cell_add(local_78->cell[0],&local_90,&local_84);
    iVar9 = iVar9 + iVar10;
    iVar15 = iVar15 + iVar10;
    if (uVar3 != 0) break;
LAB_0012e13c:
    iVar8 = iVar8 + -1;
    iVar10 = (int)local_80;
    if (iVar8 == 0) {
      local_88 = 3;
      if (iVar10 < 2) goto LAB_0012e2ef;
      iVar15 = iVar10 + -2;
      iVar9 = iVar10 * iVar10 + -2;
      iVar8 = iVar4;
      goto LAB_0012e1c3;
    }
  }
  uVar11 = (ulong)uVar3;
  pcVar12 = "edg";
  uVar7 = 0x7d1;
  goto LAB_0012df38;
  while( true ) {
    iVar8 = iVar8 + -1;
    iVar9 = iVar9 + -1;
    if (iVar8 < 1) break;
LAB_0012e1c3:
    local_90 = iVar9 + 1;
    local_8c = iVar9;
    uVar3 = ref_cell_add(local_78->cell[0],&local_90,&local_84);
    if (uVar3 != 0) {
      uVar11 = (ulong)uVar3;
      pcVar12 = "edg";
      uVar7 = 0x7d9;
      goto LAB_0012df38;
    }
  }
  local_88 = 4;
  iVar10 = (int)local_80;
  if (iVar10 < 2) {
LAB_0012e2ef:
    local_88 = 4;
    local_48 = 1;
  }
  else {
    iVar15 = iVar15 * iVar10;
    iVar10 = iVar10 * iVar4;
    iVar8 = iVar4;
    do {
      local_90 = iVar10;
      local_8c = iVar15;
      uVar3 = ref_cell_add(local_78->cell[0],&local_90,&local_84);
      if (uVar3 != 0) {
        uVar11 = (ulong)uVar3;
        pcVar12 = "edg";
        uVar7 = 0x7e1;
        goto LAB_0012df38;
      }
      iVar8 = iVar8 + -1;
      iVar9 = (int)local_80;
      iVar15 = iVar15 - iVar9;
      iVar10 = iVar10 - iVar9;
    } while (0 < iVar8);
    local_48 = 1;
    iVar10 = iVar9;
    if (1 < iVar9) {
      iVar8 = 0;
      iVar15 = 0;
      do {
        local_70 = (double)CONCAT44(local_70._4_4_,iVar15 + 1);
        local_68 = (REF_DBL)CONCAT44(local_68._4_4_,iVar8);
        iVar15 = iVar4;
        while( true ) {
          bVar16 = iVar15 == 0;
          iVar15 = iVar15 + -1;
          if (bVar16) break;
          local_50 = iVar9 + 1 + iVar8;
          local_4c = iVar8 + (int)local_80;
          local_58 = iVar8;
          local_54 = iVar8 + 1;
          uVar3 = ref_cell_add(local_78->cell[6],&local_58,&local_84);
          uVar11 = (ulong)uVar3;
          iVar8 = iVar8 + 1;
          if (uVar3 != 0) {
            pcVar12 = "qua";
            uVar7 = 0x7ec;
            goto LAB_0012df38;
          }
        }
        iVar8 = local_68._0_4_ + (int)local_80;
        iVar15 = local_70._0_4_;
        iVar10 = (int)local_80;
      } while (local_70._0_4_ != iVar4);
    }
  }
  uVar3 = ref_node_initialize_n_global(ref_node,(ulong)(uint)(iVar10 * iVar10));
  if (uVar3 == 0) {
    return 0;
  }
  uVar11 = (ulong)uVar3;
  pcVar12 = "init glob";
  uVar7 = 0x7f0;
LAB_0012df38:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar7,
         "ref_fixture_quad_brick_grid",uVar11,pcVar12);
  return (REF_STATUS)uVar11;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_quad_brick_grid(REF_GRID *ref_grid_ptr,
                                               REF_MPI ref_mpi, REF_INT dim) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, cell;
  REF_INT edg[3], quad[5];

  REF_INT m, n;
  REF_INT i, j;

  REF_DBL x0 = 0.0;
  REF_DBL x1 = 1.0;

  REF_DBL y0 = 0.0;
  REF_DBL y1 = 1.0;

  REF_DBL z = 0.0;

  REF_DBL dx, dy;

  m = dim;
  n = dim;

  dx = (x1 - x0) / ((REF_DBL)(n - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, m * n), "init glob");
    return REF_SUCCESS;
  }

  /*
  y   3 --- 2
  ^   |     |
  |   |     |
  |   0 --- 1
  |
  +----> x
  */

#define ij2node(i, j, m, n) ((i) + (j) * (m))

  for (j = 0; j < n; j++) {
    for (i = 0; i < m; i++) {
      global = ij2node(i, j, m, n);
      RSS(ref_node_add(ref_node, global, &node), "node");
      ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
      ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
      ref_node_xyz(ref_node, 2, node) = z;
    }
  }

  edg[2] = 1;
  j = 0;
  for (i = 0; i < m - 1; i++) {
    edg[0] = ij2node(i, j, m, n);
    edg[1] = ij2node(i + 1, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "qua");
  }

  edg[2] = 2;
  i = m - 1;
  for (j = 0; j < n - 1; j++) {
    edg[0] = ij2node(i, j, m, n);
    edg[1] = ij2node(i, j + 1, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  edg[2] = 3;
  j = n - 1;
  for (i = m - 2; i >= 0; i--) {
    edg[0] = ij2node(i + 1, j, m, n);
    edg[1] = ij2node(i, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  edg[2] = 4;
  i = 0;
  for (j = n - 2; j >= 0; j--) {
    edg[0] = ij2node(i, j + 1, m, n);
    edg[1] = ij2node(i, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  quad[4] = 1;
  j = 1;
  for (j = 0; j < n - 1; j++) {
    for (i = 0; i < m - 1; i++) {
      quad[0] = ij2node(i, j, m, n);
      quad[1] = ij2node(i + 1, j, m, n);
      quad[2] = ij2node(i + 1, j + 1, m, n);
      quad[3] = ij2node(i, j + 1, m, n);
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }
  }

  RSS(ref_node_initialize_n_global(ref_node, m * n), "init glob");

  return REF_SUCCESS;
}